

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O2

void slang::TimeTrace::beginTrace
               (string_view name,
               function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               detail)

{
  Profiler *this;
  allocator<char> local_51;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  
  this = profiler;
  local_50._M_str = name._M_str;
  local_50._M_len = name._M_len;
  if (profiler != (Profiler *)0x0) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_40,&local_50,&local_51);
    Profiler::begin(this,&local_40,detail);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void TimeTrace::beginTrace(string_view name, function_ref<std::string()> detail) {
    if (profiler)
        profiler->begin(std::string(name), detail);
}